

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O1

vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_> * __thiscall
chaiscript::AST_Node_Trace::get_children
          (vector<chaiscript::AST_Node_Trace,_std::allocator<chaiscript::AST_Node_Trace>_>
           *__return_storage_ptr__,AST_Node_Trace *this,AST_Node *node)

{
  vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>
  node_children;
  allocator_type local_29;
  __normal_iterator<const_std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
  local_28;
  __normal_iterator<const_std::reference_wrapper<chaiscript::AST_Node>_*,_std::vector<std::reference_wrapper<chaiscript::AST_Node>,_std::allocator<std::reference_wrapper<chaiscript::AST_Node>_>_>_>
  local_20;
  long local_18;
  
  (**node->_vptr_AST_Node)(&local_28,node);
  std::vector<chaiscript::AST_Node_Trace,std::allocator<chaiscript::AST_Node_Trace>>::
  vector<__gnu_cxx::__normal_iterator<std::reference_wrapper<chaiscript::AST_Node>const*,std::vector<std::reference_wrapper<chaiscript::AST_Node>,std::allocator<std::reference_wrapper<chaiscript::AST_Node>>>>,void>
            ((vector<chaiscript::AST_Node_Trace,std::allocator<chaiscript::AST_Node_Trace>> *)
             __return_storage_ptr__,local_28,local_20,&local_29);
  if (local_28._M_current != (reference_wrapper<chaiscript::AST_Node> *)0x0) {
    operator_delete(local_28._M_current,local_18 - (long)local_28._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<AST_Node_Trace> get_children(const AST_Node &node) {
      const auto node_children = node.get_children();
      return std::vector<AST_Node_Trace>(node_children.begin(), node_children.end());
    }